

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ConstantPaddingLayerParams::SerializeWithCachedSizes
          (ConstantPaddingLayerParams *this,CodedOutputStream *output)

{
  bool bVar1;
  int iVar2;
  uint64 value;
  float fVar3;
  int local_20;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  ConstantPaddingLayerParams *this_local;
  
  fVar3 = ConstantPaddingLayerParams::value(this);
  if ((fVar3 != 0.0) || (NAN(fVar3))) {
    fVar3 = ConstantPaddingLayerParams::value(this);
    google::protobuf::internal::WireFormatLite::WriteFloat(1,fVar3,output);
  }
  iVar2 = padamounts_size(this);
  if (0 < iVar2) {
    google::protobuf::internal::WireFormatLite::WriteTag(2,WIRETYPE_LENGTH_DELIMITED,output);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_padamounts_cached_byte_size_);
  }
  local_20 = 0;
  iVar2 = padamounts_size(this);
  for (; local_20 < iVar2; local_20 = local_20 + 1) {
    value = padamounts(this,local_20);
    google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(value,output);
  }
  bVar1 = padtogivenoutputsizemode(this);
  if (bVar1) {
    bVar1 = padtogivenoutputsizemode(this);
    google::protobuf::internal::WireFormatLite::WriteBool(3,bVar1,output);
  }
  return;
}

Assistant:

void ConstantPaddingLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ConstantPaddingLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // float value = 1;
  if (this->value() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(1, this->value(), output);
  }

  // repeated uint64 padAmounts = 2;
  if (this->padamounts_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_padamounts_cached_byte_size_);
  }
  for (int i = 0, n = this->padamounts_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64NoTag(
      this->padamounts(i), output);
  }

  // bool padToGivenOutputSizeMode = 3;
  if (this->padtogivenoutputsizemode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(3, this->padtogivenoutputsizemode(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ConstantPaddingLayerParams)
}